

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O2

void PDHG_Update_Iterate_Constant_Step_Size(CUPDLPwork *pdhg)

{
  CUPDLPiterates *pCVar1;
  CUPDLPstepsize *pCVar2;
  CUPDLPvec *x;
  CUPDLPvec *y;
  CUPDLPvec *ax;
  CUPDLPvec *aty;
  CUPDLPvec *xUpdate;
  CUPDLPvec *yUpdate;
  CUPDLPvec *ax_00;
  CUPDLPvec *aty_00;
  int iVar3;
  int iVar4;
  
  pCVar1 = pdhg->iterates;
  pCVar2 = pdhg->stepsize;
  iVar4 = pdhg->timers->nIter;
  iVar3 = iVar4 % 2;
  x = pCVar1->x[iVar3];
  y = pCVar1->y[iVar3];
  ax = pCVar1->ax[iVar3];
  aty = pCVar1->aty[iVar3];
  iVar4 = (iVar4 + 1) % 2;
  xUpdate = pCVar1->x[iVar4];
  yUpdate = pCVar1->y[iVar4];
  ax_00 = pCVar1->ax[iVar4];
  aty_00 = pCVar1->aty[iVar4];
  Ax(pdhg,ax,x);
  ATy(pdhg,aty,y);
  PDHG_primalGradientStep(pdhg,xUpdate,x,aty,pCVar2->dPrimalStep);
  Ax(pdhg,ax_00,xUpdate);
  PDHG_dualGradientStep(pdhg,yUpdate,y,ax,ax_00,pCVar2->dDualStep);
  ATy(pdhg,aty_00,yUpdate);
  return;
}

Assistant:

void PDHG_Update_Iterate_Constant_Step_Size(CUPDLPwork *pdhg) {
  //            CUPDLP_ASSERT(0);
  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPiterates *iterates = pdhg->iterates;
  CUPDLPstepsize *stepsize = pdhg->stepsize;

  cupdlp_int iter = pdhg->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];
  CUPDLPvec *xUpdate = iterates->x[(iter + 1) % 2];
  CUPDLPvec *yUpdate = iterates->y[(iter + 1) % 2];
  CUPDLPvec *axUpdate = iterates->ax[(iter + 1) % 2];
  CUPDLPvec *atyUpdate = iterates->aty[(iter + 1) % 2];

  Ax(pdhg, ax, x);
  ATy(pdhg, aty, y);

  // x^{k+1} = proj_{X}(x^k - dPrimalStep * (c - A'y^k))
  PDHG_primalGradientStep(pdhg, xUpdate, x, aty, stepsize->dPrimalStep);

  Ax(pdhg, axUpdate, xUpdate);

  // y^{k+1} = proj_{Y}(y^k + dDualStep * (b - A * (2 x^{k+1} - x^{k})))
  PDHG_dualGradientStep(pdhg, yUpdate, y, ax, axUpdate, stepsize->dDualStep);

  ATy(pdhg, atyUpdate, yUpdate);
}